

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_reservoir_sample.cpp
# Opt level: O2

void __thiscall duckdb::BaseReservoirSampling::SetNextEntry(BaseReservoirSampling *this)

{
  double dVar1;
  pointer ppVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  
  ppVar2 = (this->reservoir_weights).c.
           super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar1 = ppVar2->first;
  dVar3 = RandomEngine::NextRandom32((RandomEngine *)this);
  dVar3 = log(dVar3);
  dVar4 = log(-dVar1);
  this->min_weight_threshold = -dVar1;
  this->min_weighted_entry_index = ppVar2->second;
  dVar1 = round(dVar3 / dVar4);
  uVar5 = (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1;
  this->next_index_to_sample = uVar5 + (uVar5 == 0);
  this->num_entries_to_skip_b4_next_sample = 0;
  return;
}

Assistant:

void BaseReservoirSampling::SetNextEntry() {
	D_ASSERT(!reservoir_weights.empty());
	//! 4. Let r = random(0, 1) and Xw = log(r) / log(T_w)
	auto &min_key = reservoir_weights.top();
	double t_w = -min_key.first;
	double r = random.NextRandom32();
	double x_w = log(r) / log(t_w);
	//! 5. From the current item vc skip items until item vi , such that:
	//! 6. wc +wc+1 +···+wi−1 < Xw <= wc +wc+1 +···+wi−1 +wi
	//! since all our weights are 1 (uniform sampling), we can just determine the amount of elements to skip
	min_weight_threshold = t_w;
	min_weighted_entry_index = min_key.second;
	next_index_to_sample = MaxValue<idx_t>(1, idx_t(round(x_w)));
	num_entries_to_skip_b4_next_sample = 0;
}